

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void toggle_overlays(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  Fl_Widget_Type *w;
  Fl_Type *pFVar2;
  bool bVar3;
  
  bVar3 = overlays_invisible == 0;
  overlays_invisible = (int)bVar3;
  Main_Menu[0x28].text = "Hide O&verlays";
  pFVar2 = Fl_Type::first;
  if (bVar3) {
    Main_Menu[0x28].text = "Show O&verlays";
  }
  for (; pFVar2 != (Fl_Type *)0x0; pFVar2 = pFVar2->next) {
    iVar1 = (*pFVar2->_vptr_Fl_Type[0x21])(pFVar2);
    if (iVar1 != 0) {
      Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)pFVar2[1].prev);
    }
  }
  return;
}

Assistant:

void toggle_overlays(Fl_Widget *,void *) {
  overlays_invisible = !overlays_invisible;

  if (overlays_invisible) Main_Menu[40].label("Show O&verlays");
  else Main_Menu[40].label("Hide O&verlays");

  for (Fl_Type *o=Fl_Type::first; o; o=o->next)
    if (o->is_window()) {
      Fl_Widget_Type* w = (Fl_Widget_Type*)o;
      ((Overlay_Window*)(w->o))->redraw_overlay();
    }
}